

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitLocalGet(FunctionValidator *this,LocalGet *curr)

{
  uint uVar1;
  SpecificExpression<(wasm::Expression::Id)8> *pSVar2;
  bool bVar3;
  Function *pFVar4;
  size_t sVar5;
  Type local_20;
  LocalGet *local_18;
  LocalGet *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (LocalGet *)this;
  bVar3 = wasm::Type::isConcrete
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                      type);
  shouldBeTrue<wasm::LocalGet*>
            (this,bVar3,local_18,
             "local.get must have a valid type - check what you provided when you constructed the node"
            );
  uVar1 = local_18->index;
  pFVar4 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
  sVar5 = Function::getNumLocals(pFVar4);
  bVar3 = shouldBeTrue<wasm::LocalGet*>
                    (this,uVar1 < sVar5,local_18,"local.get index must be small enough");
  if (bVar3) {
    pSVar2 = &local_18->super_SpecificExpression<(wasm::Expression::Id)8>;
    pFVar4 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                          ).
                          super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .
                          super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        );
    local_20 = Function::getLocalType(pFVar4,local_18->index);
    bVar3 = wasm::Type::operator==(&(pSVar2->super_Expression).type,&local_20);
    shouldBeTrue<wasm::LocalGet*>(this,bVar3,local_18,"local.get must have proper type");
  }
  return;
}

Assistant:

void FunctionValidator::visitLocalGet(LocalGet* curr) {
  shouldBeTrue(curr->type.isConcrete(),
               curr,
               "local.get must have a valid type - check what you provided "
               "when you constructed the node");
  if (shouldBeTrue(curr->index < getFunction()->getNumLocals(),
                   curr,
                   "local.get index must be small enough")) {
    shouldBeTrue(curr->type == getFunction()->getLocalType(curr->index),
                 curr,
                 "local.get must have proper type");
  }
}